

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O2

void __thiscall
MeteomaticsApiClient::MeteomaticsApiClient
          (MeteomaticsApiClient *this,string *user,string *password,int timeout_seconds)

{
  HttpClient *this_00;
  allocator local_49;
  string local_48;
  
  this_00 = (HttpClient *)operator_new(0x60);
  std::__cxx11::string::string((string *)&local_48,"api.meteomatics.com",&local_49);
  MMIntern::HttpClient::HttpClient(this_00,&local_48,user,password);
  std::__cxx11::string::~string((string *)&local_48);
  this->httpClient = this_00;
  this->dataRequestTimeout = timeout_seconds;
  return;
}

Assistant:

MeteomaticsApiClient::MeteomaticsApiClient(const std::string& user, const std::string& password, const int timeout_seconds)
: httpClient(new MMIntern::HttpClient("api.meteomatics.com", user, password))
, dataRequestTimeout(timeout_seconds)
{
}